

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall discordpp::RoleTags::RoleTags(RoleTags *this,RoleTags *param_1)

{
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var1;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var2;
  _Head_base<0UL,_std::nullptr_t_*,_false> _Var3;
  
  _Var1._M_head_impl =
       (param_1->bot_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    _Var2._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var2._M_head_impl = (Snowflake *)operator_new(8);
    (_Var2._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->bot_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var2._M_head_impl;
  (this->bot_id).super_field<discordpp::Snowflake>.s_ =
       (param_1->bot_id).super_field<discordpp::Snowflake>.s_;
  (this->bot_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a5e8;
  _Var1._M_head_impl =
       (param_1->integration_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    _Var2._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var2._M_head_impl = (Snowflake *)operator_new(8);
    (_Var2._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->integration_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var2._M_head_impl;
  (this->integration_id).super_field<discordpp::Snowflake>.s_ =
       (param_1->integration_id).super_field<discordpp::Snowflake>.s_;
  (this->integration_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a5e8;
  if ((param_1->premium_subscriber).super_field<std::nullptr_t>.t_._M_t.
      super___uniq_ptr_impl<std::nullptr_t,_std::default_delete<std::nullptr_t>_>._M_t.
      super__Tuple_impl<0UL,_std::nullptr_t_*,_std::default_delete<std::nullptr_t>_>.
      super__Head_base<0UL,_std::nullptr_t_*,_false>._M_head_impl == (void **)0x0) {
    _Var3._M_head_impl = (void **)0x0;
  }
  else {
    _Var3._M_head_impl = (void **)operator_new(8);
    *_Var3._M_head_impl = (void *)0x0;
  }
  (this->premium_subscriber).super_field<std::nullptr_t>.t_._M_t.
  super___uniq_ptr_impl<std::nullptr_t,_std::default_delete<std::nullptr_t>_>._M_t.
  super__Tuple_impl<0UL,_std::nullptr_t_*,_std::default_delete<std::nullptr_t>_>.
  super__Head_base<0UL,_std::nullptr_t_*,_false>._M_head_impl = _Var3._M_head_impl;
  (this->premium_subscriber).super_field<std::nullptr_t>.s_ =
       (param_1->premium_subscriber).super_field<std::nullptr_t>.s_;
  (this->premium_subscriber)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a628;
  _Var1._M_head_impl =
       (param_1->subscription_listing_id).super_field<discordpp::Snowflake>.t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    _Var2._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var2._M_head_impl = (Snowflake *)operator_new(8);
    (_Var2._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->subscription_listing_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var2._M_head_impl;
  (this->subscription_listing_id).super_field<discordpp::Snowflake>.s_ =
       (param_1->subscription_listing_id).super_field<discordpp::Snowflake>.s_;
  (this->subscription_listing_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a5e8;
  if ((param_1->available_for_purchase).super_field<std::nullptr_t>.t_._M_t.
      super___uniq_ptr_impl<std::nullptr_t,_std::default_delete<std::nullptr_t>_>._M_t.
      super__Tuple_impl<0UL,_std::nullptr_t_*,_std::default_delete<std::nullptr_t>_>.
      super__Head_base<0UL,_std::nullptr_t_*,_false>._M_head_impl == (void **)0x0) {
    _Var3._M_head_impl = (void **)0x0;
  }
  else {
    _Var3._M_head_impl = (void **)operator_new(8);
    *_Var3._M_head_impl = (void *)0x0;
  }
  (this->available_for_purchase).super_field<std::nullptr_t>.t_._M_t.
  super___uniq_ptr_impl<std::nullptr_t,_std::default_delete<std::nullptr_t>_>._M_t.
  super__Tuple_impl<0UL,_std::nullptr_t_*,_std::default_delete<std::nullptr_t>_>.
  super__Head_base<0UL,_std::nullptr_t_*,_false>._M_head_impl = _Var3._M_head_impl;
  (this->available_for_purchase).super_field<std::nullptr_t>.s_ =
       (param_1->available_for_purchase).super_field<std::nullptr_t>.s_;
  (this->available_for_purchase)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a628;
  if ((param_1->guild_connections).super_field<std::nullptr_t>.t_._M_t.
      super___uniq_ptr_impl<std::nullptr_t,_std::default_delete<std::nullptr_t>_>._M_t.
      super__Tuple_impl<0UL,_std::nullptr_t_*,_std::default_delete<std::nullptr_t>_>.
      super__Head_base<0UL,_std::nullptr_t_*,_false>._M_head_impl == (void **)0x0) {
    _Var3._M_head_impl = (void **)0x0;
  }
  else {
    _Var3._M_head_impl = (void **)operator_new(8);
    *_Var3._M_head_impl = (void *)0x0;
  }
  (this->guild_connections).super_field<std::nullptr_t>.t_._M_t.
  super___uniq_ptr_impl<std::nullptr_t,_std::default_delete<std::nullptr_t>_>._M_t.
  super__Tuple_impl<0UL,_std::nullptr_t_*,_std::default_delete<std::nullptr_t>_>.
  super__Head_base<0UL,_std::nullptr_t_*,_false>._M_head_impl = _Var3._M_head_impl;
  (this->guild_connections).super_field<std::nullptr_t>.s_ =
       (param_1->guild_connections).super_field<std::nullptr_t>.s_;
  (this->guild_connections)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a628;
  return;
}

Assistant:

RoleTags(
        omittable_field<Snowflake> bot_id = omitted,
        omittable_field<Snowflake> integration_id = omitted,
        omittable_field<std::nullptr_t> premium_subscriber = omitted,
        omittable_field<Snowflake> subscription_listing_id = omitted,
        omittable_field<std::nullptr_t> available_for_purchase = omitted,
        omittable_field<std::nullptr_t> guild_connections = omitted
    ):
        bot_id(bot_id),
        integration_id(integration_id),
        premium_subscriber(premium_subscriber),
        subscription_listing_id(subscription_listing_id),
        available_for_purchase(available_for_purchase),
        guild_connections(guild_connections)
    {}